

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

SequenceRepeatLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_sequencerepeat(NeuralNetworkLayer *this)

{
  bool bVar1;
  SequenceRepeatLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_sequencerepeat(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_sequencerepeat(this);
    this_00 = (SequenceRepeatLayerParams *)operator_new(0x20);
    SequenceRepeatLayerParams::SequenceRepeatLayerParams(this_00);
    (this->layer_).sequencerepeat_ = this_00;
  }
  return (SequenceRepeatLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SequenceRepeatLayerParams* NeuralNetworkLayer::mutable_sequencerepeat() {
  if (!has_sequencerepeat()) {
    clear_layer();
    set_has_sequencerepeat();
    layer_.sequencerepeat_ = new ::CoreML::Specification::SequenceRepeatLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.sequenceRepeat)
  return layer_.sequencerepeat_;
}